

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall
CRegexParser::build_group
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int group_id)

{
  re_tuple_conflict *prVar1;
  re_state_id rVar2;
  
  rVar2 = alloc_state(this);
  new_machine->init = rVar2;
  rVar2 = alloc_state(this);
  new_machine->final = rVar2;
  if ((long)new_machine->init != -1) {
    rVar2 = sub_machine->init;
    prVar1 = this->tuple_arr_ + new_machine->init;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_GROUP_ENTER;
      (prVar1->info).loop.loop_min = group_id;
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  if ((long)sub_machine->final != -1) {
    rVar2 = new_machine->final;
    prVar1 = this->tuple_arr_ + sub_machine->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_GROUP_EXIT;
      (prVar1->info).loop.loop_min = group_id;
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  return;
}

Assistant:

void CRegexParser::build_group(re_machine *new_machine,
                               re_machine *sub_machine, int group_id)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* 
     *   Set up a group-entry transition from the new machine's initial
     *   state into the initial state of the group, and a group-exit
     *   transition from the group's final state into the container's final
     *   state.  For both transitions, store the group ID in the character
     *   field of the transition, to identify which group is affected.  
     */
    set_trans(new_machine->init, sub_machine->init,
              RE_GROUP_ENTER, (wchar_t)group_id);
    set_trans(sub_machine->final, new_machine->final,
              RE_GROUP_EXIT, (wchar_t)group_id);
}